

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int StartUBXThreadubloxx(UBLOX *publox)

{
  int iVar1;
  long lVar2;
  THREAD_IDENTIFIER *pThreadId;
  CRITICAL_SECTION *pCriticalSection;
  
  pCriticalSection = ubloxCS;
  pThreadId = ubloxUBXThreadId;
  lVar2 = 0;
  do {
    if (*(UBLOX **)((long)addrsublox + lVar2 * 2) == publox) {
      *(undefined4 *)((long)resublox + lVar2) = 1;
      *(undefined4 *)((long)bExitUBXublox + lVar2) = 0;
      memset(ubxdataublox,0,0x1b8);
      InitCriticalSection(pCriticalSection);
      iVar1 = CreateDefaultThread(ubloxUBXThread,publox,pThreadId);
      return iVar1;
    }
    lVar2 = lVar2 + 4;
    pCriticalSection = pCriticalSection + 1;
    pThreadId = pThreadId + 1;
  } while (lVar2 != 0x40);
  return 1;
}

Assistant:

HARDWAREX_API int StartUBXThreadubloxx(UBLOX* publox)
{
	int id = 0;

	while (addrsublox[id] != publox)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	resublox[id] = EXIT_FAILURE;
	bExitUBXublox[id] = FALSE;
	memset(&ubxdataublox, 0, sizeof(UBXDATA));
	InitCriticalSection(&ubloxCS[id]);
	return CreateDefaultThread(ubloxUBXThread, (void*)publox, &ubloxUBXThreadId[id]);
}